

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schedules.cpp
# Opt level: O0

void CASC::Schedules::getLtb2017MzrSchedule(Property *property,Schedule *sched)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff298;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff2a0;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  allocator<char> *in_stack_fffffffffffff2c0;
  allocator<char> *__a;
  char *in_stack_fffffffffffff2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_9a1;
  string local_9a0 [39];
  undefined1 local_979 [40];
  allocator<char> local_951;
  string local_950 [39];
  allocator<char> local_929;
  string local_928 [39];
  undefined1 local_901 [40];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [39];
  allocator<char> local_861;
  string local_860 [39];
  allocator<char> local_839;
  string local_838 [39];
  allocator<char> local_811;
  string local_810 [39];
  allocator<char> local_7e9;
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [39];
  allocator<char> local_749;
  string local_748 [39];
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [39];
  allocator<char> local_6a9;
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [39];
  allocator<char> local_609;
  string local_608 [39];
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [39];
  allocator<char> local_569;
  string local_568 [39];
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8 [39];
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [39];
  allocator<char> local_429;
  string local_428 [39];
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [39];
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator(&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_901;
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffff2c0);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string((string *)(local_901 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_901);
  __a = &local_929;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_928);
  std::allocator<char>::~allocator(&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  this = (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         local_979;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (this,local_10);
  std::__cxx11::string::~string((string *)(local_979 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::push
            (this,local_10);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  return;
}

Assistant:

void Schedules::getLtb2017MzrSchedule(const Property& property, Schedule& sched) {
  sched.push("ott-11_8:1_drc=ordering:bsr=unit_only:lcm=predicate:nwc=1:sd=2:ss=axioms:st=1.2:sos=all:av=off:sp=reverse_arity_60"); // MZR 1 (828)
  sched.push("ott+1010_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:ccuc=first:cond=fast:fde=unused:gs=on:gsem=on:nwc=1:sd=2:ss=axioms:sos=on:sac=on:aac=none:acc=on:aer=off:afp=1000:afq=2.0:anc=all_dependent:sp=reverse_arity:urr=on:updr=off_60"); // MZR 2 (112)
  sched.push("lrs+1004_2_drc=ordering:bd=off:ccuc=small_ones:gs=on:gsem=off:gsssp=full:lwlo=on:nm=0:nwc=1:stl=300:sd=4:st=5.0:sos=all:sac=on:acc=on:add=off:aer=off:afp=100000:afq=1.2:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 4 (47)
  sched.push("dis+10_5_drc=ordering:bsr=unit_only:cond=on:ep=RS:fde=unused:nm=0:nwc=1:sd=1:ss=axioms:sos=all:av=off_60"); // MZR 5 (37)
  sched.push("lrs+11_5:1_drc=ordering:br=off:cond=fast:fde=unused:gsp=on:gs=on:gsem=on:gsssp=full:lcm=predicate:nm=0:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=1.2:sac=on:add=large:afr=on:afp=40000:afq=1.4:amm=sco:anc=all:urr=on_60"); // MZR 6 (32)
  sched.push("lrs+1011_8:1_drc=ordering:cond=on:fde=none:gsp=on:lwlo=on:nwc=1:stl=300:sd=2:ss=axioms:sos=all:av=off:sp=reverse_arity:urr=ec_only:updr=off:uhcvi=on_60"); // MZR 7 (22)
  sched.push("lrs+11_3_drc=ordering:br=off:cond=fast:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.5:sos=all:sac=on:afr=on:afp=1000:afq=2.0:amm=sco:anc=none:sp=occurrence:urr=on:uhcvi=on_60"); // MZR 8 (21)
  sched.push("dis+10_2:1_drc=ordering:cond=fast:ep=RST:fsr=off:fde=unused:gsp=on:gs=on:gsaa=full_model:gsem=off:nm=0:nwc=1:sd=1:ss=axioms:st=5.0:sos=on:sac=on:add=off:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"); // MZR 9 (19)
  sched.push("lrs+1002_1_drc=ordering:bsr=unit_only:nwc=1:stl=300:sd=1:ss=axioms:st=1.5:sos=all:av=off:updr=off:uhcvi=on_60"); // MZR 10 (14)
  sched.push("lrs+1_1_drc=ordering:bs=on:bsr=on:br=off:cond=fast:fsr=off:gs=on:gsem=off:lwlo=on:nwc=3:stl=300:sd=3:add=large:afr=on:afp=40000:afq=1.4:amm=off:anc=none:sp=occurrence:urr=on:updr=off_60"); // MZR 11 (11)
  sched.push("lrs-2_1_drc=ordering:cond=on:fde=unused:gs=on:gsaa=from_current:gsssp=full:lcm=predicate:nwc=1:stl=300:sd=4:ss=axioms:st=3.0:sos=on:sac=on:afr=on:afp=10000:afq=1.1:anc=none:updr=off_60"); // MZR 12 (11)
  sched.push("lrs+10_8:1_drc=ordering:bsr=unit_only:br=off:cond=on:fsr=off:gsp=on:gs=on:gsaa=from_current:nm=0:nwc=1:stl=300:sd=2:ss=axioms:st=1.2:sos=on:sac=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:urr=on:updr=off:uhcvi=on_60"); // MZR 13 (10)
  sched.push("dis+11_12_drc=ordering:cond=fast:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=reverse_arity:uhcvi=on_60"); // MZR 14 (8)
  sched.push("dis+1010_3_drc=ordering:bsr=unit_only:cond=fast:fde=none:nwc=1:sd=2:ss=axioms:st=1.5:sos=all:av=off:sp=occurrence:uhcvi=on_60"); // MZR 15 (8)
  sched.push("dis+1002_2:3_drc=ordering:fde=none:gsp=on:nm=0:nwc=1:sd=3:ss=axioms:sos=on:sac=on:afp=100000:afq=1.0:amm=sco:anc=none:sp=occurrence:updr=off_60"); // MZR 16 (7)
  sched.push("lrs+10_3:1_drc=ordering:fde=unused:lcm=reverse:nwc=1:stl=300:sd=3:st=2.0:sos=all:av=off:sp=occurrence:uhcvi=on_60"); // MZR 17 (6)
  sched.push("lrs+10_2:3_drc=ordering:bsr=unit_only:cond=on:fde=none:gs=on:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:sp=reverse_arity_60"); // MZR 18 (6)
  sched.push("dis+1004_3:1_drc=ordering:bsr=unit_only:ep=R:fde=unused:gs=on:gsssp=full:nm=0:nwc=1:sos=all:sac=on:afr=on:afp=10000:afq=2.0:anc=all:sp=reverse_arity:urr=on:updr=off_60"); // MZR 19 (5)
  sched.push("ott+4_5:1_drc=ordering:br=off:cond=fast:fsr=off:nwc=1.3:av=off:sp=occurrence:urr=on:uhcvi=on_60"); // MZR 20 (5)
  sched.push("dis+1010_1_drc=ordering:cond=fast:fsr=off:nwc=1.3:sd=2:ss=axioms:st=1.5:sos=on:acc=model:add=off:afp=4000:afq=2.0:uhcvi=on_60"); // MZR 21 (5)
  sched.push("lrs+11_2_drc=ordering:bd=off:bsr=unit_only:cond=on:lcm=predicate:lwlo=on:nm=64:nwc=1.1:stl=300:sd=1:ss=axioms:st=2.0:sos=all:av=off_60"); // MZR 22 (5)
  sched.push("lrs+10_4:1_drc=ordering:bd=off:cond=fast:fde=unused:lcm=reverse:nm=0:nwc=1.2:stl=300:sd=2:ss=axioms:sos=all:av=off_60"); // MZR 23 (5)
  sched.push("dis+10_5_drc=ordering:ep=RST:fsr=off:gs=on:gsssp=full:lwlo=on:nm=0:nwc=1:sd=4:ss=axioms:sos=on:afr=on:afp=40000:afq=1.1:amm=off:anc=none:uhcvi=on_60"); // MZR 24 (4)
  sched.push("dis+1002_3_drc=ordering:ep=RST:fde=unused:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:ss=axioms:st=2.0:sos=on:afp=100000:afq=1.1:anc=none:sp=occurrence:uhcvi=on_60"); // MZR 25 (4)
  sched.push("dis+10_5_drc=ordering:cond=on:fsr=off:fde=none:gs=on:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off_60"); // MZR 26 (4)
  sched.push("ott-11_8:1_drc=ordering:bd=preordered:ccuc=first:er=known:fsr=off:fde=unused:gsp=on:lcm=predicate:nm=0:nwc=2:sd=3:ss=axioms:acc=on:afp=10000:afq=2.0:amm=sco:sp=occurrence:updr=off_60"); // MZR 27 (4)
  sched.push("lrs+1011_1_drc=ordering:cond=on:fsr=off:gs=on:nwc=1:stl=300:sd=4:st=1.2:sos=on:av=off:sp=reverse_arity:urr=on_60"); // MZR 29 (3)
  sched.push("lrs+11_3:1_drc=ordering:bsr=unit_only:br=off:cond=on:ep=RST:fsr=off:gs=on:gsaa=from_current:gsem=off:nwc=3:stl=300:sd=2:ss=axioms:st=2.0:sac=on:add=large:afr=on:afp=100000:afq=1.4:amm=sco:anc=none:sp=reverse_arity:urr=on_60"); // MZR 30 (3)
  sched.push("dis+11_5:4_drc=ordering:ccuc=first:cond=on:er=known:fde=none:gs=on:nwc=1:sd=2:st=1.2:sos=all:aac=none:acc=model:add=large:afr=on:afp=10000:afq=1.2:anc=all_dependent:sp=reverse_arity:urr=on:uhcvi=on_60"); // MZR 32 (3)
  sched.push("lrs+1010_2_drc=ordering:cond=on:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:st=1.2:sos=all:av=off:uhcvi=on_60"); // MZR 33 (3)
  sched.push("lrs+10_5:4_drc=ordering:bd=off:ccuc=small_ones:cond=on:fde=none:gs=on:gsaa=from_current:gsem=off:nm=0:nwc=1:stl=300:sd=2:sos=on:acc=model:add=large:aer=off:afp=100000:afq=1.4:anc=none:urr=on_60"); // MZR 35 (2)
  sched.push("dis+11_1_drc=ordering:ccuc=first:cond=on:fsr=off:fde=none:gs=on:gsem=off:lcm=predicate:nm=0:nwc=1:nicw=on:sd=3:acc=model:add=large:afp=4000:afq=1.4:anc=all:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 36 (2)
  sched.push("dis+1_1_drc=ordering:fsr=off:gs=on:gsem=on:nwc=1:sd=1:ss=axioms:st=5.0:sos=all:acc=on:afr=on:afp=10000:afq=1.0:amm=sco:anc=none:sp=reverse_arity_60"); // MZR 37 (2)
  sched.push("dis+1004_2_drc=ordering:bs=unit_only:bsr=unit_only:fde=unused:gs=on:nwc=1:sos=on:add=large:afr=on_60"); // MZR 38 (2)
  sched.push("dis+11_4_drc=ordering:ep=RS:fde=none:gs=on:gsaa=full_model:gsem=off:nwc=1:sd=1:st=1.2:sos=all:sac=on:afp=10000:afq=1.1:amm=sco:anc=none:sp=reverse_arity:uhcvi=on_60"); // MZR 39 (2)
  sched.push("lrs+11_8_drc=ordering:br=off:cond=on:fde=none:gs=on:gsem=on:gsssp=full:nwc=1:nicw=on:stl=300:sd=1:ss=axioms:st=5.0:sos=all:sac=on:add=off:afp=100000:afq=1.4:amm=off:anc=all:sp=reverse_arity:urr=on:uhcvi=on_60"); // MZR 40 (2)
  sched.push("ott+1_28_drc=ordering:cond=fast:er=filter:fde=none:gsp=on:lcm=reverse:nwc=1.1:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"); // MZR 41 (2)
  sched.push("dis+10_14_drc=ordering:cond=fast:gs=on:gsaa=full_model:gsem=off:gsssp=full:nwc=1.5:sd=1:ss=axioms:st=1.5:afp=40000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off_60"); // MZR 43 (2)
  sched.push("lrs+11_5_drc=ordering:fde=none:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:urr=on_60"); // MZR 45 (2)
  sched.push("lrs-10_4:1_drc=ordering:cond=on:fsr=off:fde=unused:gsp=on:gs=on:gsem=on:nwc=1:stl=300:sd=3:ss=axioms:sos=on:av=off:urr=on_60"); // MZR 46 (2)
  sched.push("lrs+3_3:1_drc=ordering:bd=preordered:bs=on:bsr=unit_only:fsr=off:fde=unused:gs=on:gsem=off:nwc=1:nicw=on:stl=300:sd=2:ss=axioms:st=3.0:sos=all:sac=on:add=large:afp=40000:afq=1.2:amm=sco:anc=all_dependent:sp=reverse_arity:urr=ec_only_60"); // MZR 47 (2)
  sched.push("dis+11_3_drc=ordering:cond=fast:fsr=off:nwc=1:sd=1:ss=axioms:st=5.0:add=off:afr=on:afp=4000:afq=1.1:anc=none:sp=occurrence:updr=off_60"); // MZR 48 (1)
  sched.push("dis+11_4_drc=ordering:bd=off:fsr=off:fde=unused:gs=on:gsaa=full_model:gsem=on:nwc=1:sd=1:ss=axioms:sac=on:add=large:afp=1000:afq=2.0:amm=sco:anc=none:sp=reverse_arity_60"); // MZR 49 (1)
  sched.push("dis+1010_2_drc=ordering:bs=on:cond=fast:ep=RSTC:fde=unused:lwlo=on:nwc=1:sos=on:sac=on:add=off:afr=on:afp=10000:afq=1.4:sp=reverse_arity:uhcvi=on_60"); // MZR 50 (1)
  sched.push("dis+10_5_drc=ordering:fsr=off:fde=unused:gs=on:gsem=on:gsssp=full:lcm=reverse:nwc=1:sd=2:ss=axioms:sos=on:add=large:afr=on:afp=1000:afq=1.1:amm=sco:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 51 (1)
  sched.push("lrs+1_4:1_drc=ordering:br=off:cond=on:er=known:fsr=off:fde=unused:gs=on:nm=0:nwc=1:stl=600:sd=1:st=1.5:sos=on:sac=on:add=off:afp=4000:afq=1.1:amm=sco:anc=none:urr=on:updr=off:uhcvi=on_60"); // MZR 52 (1)
  sched.push("dis+1010_5_drc=ordering:cond=fast:fde=unused:gs=on:gsem=on:nm=0:nwc=1:sd=2:ss=axioms:st=3.0:sos=on:av=off:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 54 (1)
  sched.push("lrs+11_8:1_drc=ordering:bd=off:fde=unused:nwc=1:stl=300:sd=2:ss=axioms:sos=on:av=off:updr=off:uhcvi=on_60"); // MZR 55 (1)
  sched.push("lrs+1003_4_drc=ordering:cond=on:fsr=off:fde=none:gs=on:gsem=off:nwc=1:stl=300:sd=3:sos=on:av=off:sp=reverse_arity:updr=off:uhcvi=on_60"); // MZR 56 (1)
  sched.push("dis-10_2:3_drc=ordering:cond=on:fde=none:nwc=1:sd=2:ss=axioms:st=2.0:sos=on:av=off:updr=off:uhcvi=on_60"); // MZR 57 (1)
  sched.push("dis+10_3_drc=ordering:cond=fast:fde=unused:gs=on:gsem=off:lwlo=on:nwc=1:sd=3:ss=axioms:sos=on:add=large:afp=10000:afq=2.0:anc=none:sp=reverse_arity_60"); // MZR 58 (1)
  sched.push("lrs+11_4_drc=ordering:cond=on:fsr=off:fde=none:gsp=on:gs=on:gsem=on:gsssp=full:nwc=1:stl=300:sd=1:ss=axioms:st=2.0:sac=on:add=off:aer=off:afp=100000:afq=1.4:anc=none:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 59 (1)
  sched.push("ott+10_5:1_drc=ordering:bsr=unit_only:er=known:fsr=off:fde=none:gsp=on:lcm=reverse:nwc=2:av=off:sp=reverse_arity:urr=ec_only:uhcvi=on_60"); // MZR 60 (1)
  sched.push("ott+11_3:1_drc=ordering:bs=unit_only:bsr=unit_only:br=off:cond=on:fsr=off:fde=none:nwc=1:sd=1:ss=axioms:st=1.5:sos=on:av=off:sp=occurrence:urr=on_60"); // MZR 61 (1)
  sched.push("dis-11_5:1_drc=ordering:bd=off:bsr=on:ccuc=small_ones:cond=on:fsr=off:fde=none:gs=on:lcm=predicate:nwc=10:acc=on:aer=off:afp=1000:afq=1.1:sp=occurrence:uhcvi=on_60"); // MZR 62 (1)
  sched.push("dis+11_5_drc=ordering_60"); // MZR 63 (1)
  sched.push("lrs+1_8:1_drc=ordering:bsr=on:fde=none:gs=on:lcm=reverse:nwc=1:stl=300:sd=2:st=1.5:sos=all:av=off:sp=reverse_arity_60"); // MZR 64 (1)
  sched.push("lrs+11_12_drc=ordering:cond=fast:fde=unused:nwc=1:stl=600:sd=2:sos=all:av=off:sp=reverse_arity:uhcvi=on_60"); // MZR 65 (1)
  sched.push("lrs+11_5:1_drc=ordering:bsr=unit_only:br=off:cond=fast:fsr=off:gs=on:nwc=1.2:stl=300:sd=1:ss=axioms:st=5.0:sos=all:av=off:sp=reverse_arity:urr=on_60"); // MZR 66 (1)
  sched.push("lrs+1004_5:1_drc=ordering:ep=RST:fsr=off:nm=64:nwc=1.2:stl=600:add=off:aer=off:afr=on:afp=100000:afq=1.4:sp=occurrence:updr=off:uhcvi=on_60"); // MZR 67 (1)
  sched.push("dis-11_1_drc=ordering:cond=fast:nm=0:nwc=1:sd=2:ss=axioms:sac=on:acc=model:afr=on:afp=100000:afq=1.2:amm=off:anc=all_dependent:sp=reverse_arity:uhcvi=on_60"); // MZR 68 (1)
}